

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_State::Dispatch_State(Dispatch_State *this,Dispatch_Engine *t_engine)

{
  Stack_Holder *__uref;
  Type_Conversions *t_conversions;
  Type_Conversions *this_00;
  Conversion_Saves *t_saves;
  Dispatch_Engine *t_engine_local;
  Dispatch_State *this_local;
  
  std::reference_wrapper<chaiscript::detail::Dispatch_Engine>::
  reference_wrapper<chaiscript::detail::Dispatch_Engine&,void,chaiscript::detail::Dispatch_Engine*>
            (&this->m_engine,t_engine);
  __uref = Dispatch_Engine::get_stack_holder(t_engine);
  std::reference_wrapper<chaiscript::detail::Stack_Holder>::
  reference_wrapper<chaiscript::detail::Stack_Holder&,void,chaiscript::detail::Stack_Holder*>
            (&this->m_stack_holder,__uref);
  t_conversions = Dispatch_Engine::conversions(t_engine);
  this_00 = Dispatch_Engine::conversions(t_engine);
  t_saves = Type_Conversions::conversion_saves(this_00);
  Type_Conversions_State::Type_Conversions_State(&this->m_conversions,t_conversions,t_saves);
  return;
}

Assistant:

explicit Dispatch_State(Dispatch_Engine &t_engine)
          : m_engine(t_engine)
          , m_stack_holder(t_engine.get_stack_holder())
          , m_conversions(t_engine.conversions(), t_engine.conversions().conversion_saves()) {
      }